

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

void __thiscall dg::llvmdg::LLVMPTACallGraphImpl::_build(LLVMPTACallGraphImpl *this)

{
  Function *parent;
  Function *pFVar1;
  Function *B;
  Function *__range3;
  StringRef SVar2;
  Function *entry;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> queue;
  Function *local_b8;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> local_b0;
  
  SVar2.Length = (size_t)(this->_pta->options).super_LLVMAnalysisOptions.entryFunction._M_dataplus.
                         _M_p;
  SVar2.Data = (char *)this->_module;
  local_b8 = (Function *)llvm::Module::getFunction(SVar2);
  GenericCallGraph<const_llvm::Function_*>::getOrCreate(&this->_cg,&local_b8);
  local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b0._queue.Container.c.
  super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
  _M_initialize_map((_Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                    &local_b0._queue,0);
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push(&local_b0,&local_b8);
  if (local_b0._queue.Container.c.
      super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      local_b0._queue.Container.c.
      super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      parent = *local_b0._queue.Container.c.
                super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_b0._queue.Container.c.
          super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl
          .super__Deque_impl_data._M_start._M_cur ==
          local_b0._queue.Container.c.
          super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl
          .super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b0._queue.Container.c.
                        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_b0._queue.Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b0._queue.Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_b0._queue.Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_first =
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b0._queue.Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b0._queue.Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      for (pFVar1 = *(Function **)(parent + 0x50); pFVar1 != parent + 0x48;
          pFVar1 = *(Function **)(pFVar1 + 8)) {
        B = pFVar1 + -0x18;
        if (pFVar1 == (Function *)0x0) {
          B = (Function *)0x0;
        }
        processBBlock(this,parent,(BasicBlock *)B,&local_b0);
      }
    } while (local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b0._queue.Container.c.
             super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Deque_base
            ((_Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
             &local_b0._queue);
  std::
  _Rb_tree<const_llvm::Function_*,_const_llvm::Function_*,_std::_Identity<const_llvm::Function_*>,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
  ::_M_erase((_Rb_tree<const_llvm::Function_*,_const_llvm::Function_*,_std::_Identity<const_llvm::Function_*>,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
              *)&local_b0,
             (_Link_type)local_b0._queued._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void _build() {
        auto *entry = _module->getFunction(_pta->getOptions().entryFunction);
        assert(entry && "Entry function not found");
        _cg.createNode(entry);

        ADT::SetQueue<QueueFIFO<const llvm::Function *>> queue;
        queue.push(entry);

        while (!queue.empty()) {
            const auto *cur = queue.pop();
            for (const auto &B : *cur) {
                processBBlock(cur, B, queue);
            }
        }
    }